

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdTruth(Kit_DsdNtk_t *pNtk,uint *pTruthRes)

{
  Kit_DsdMan_t *p;
  uint *pIn;
  
  p = Kit_DsdManAlloc((uint)pNtk->nVars,(uint)pNtk->nNodes + (uint)pNtk->nVars);
  pIn = Kit_DsdTruthCompute(p,pNtk);
  Kit_TruthCopy(pTruthRes,pIn,(uint)pNtk->nVars);
  Kit_DsdManFree(p);
  return;
}

Assistant:

void Kit_DsdTruth( Kit_DsdNtk_t * pNtk, unsigned * pTruthRes )
{
    Kit_DsdMan_t * p;
    unsigned * pTruth;
    p = Kit_DsdManAlloc( pNtk->nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruth = Kit_DsdTruthCompute( p, pNtk );
    Kit_TruthCopy( pTruthRes, pTruth, pNtk->nVars );
    Kit_DsdManFree( p );
}